

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artitele.cpp
# Opt level: O0

bool __thiscall AArtiTeleport::Use(AArtiTeleport *this,bool pickup)

{
  short sVar1;
  player_t *activator;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FPlayerStart *pFVar5;
  AActor *pAVar6;
  FSoundID local_70;
  byte local_69;
  bool canlaugh;
  TVector3<double> local_60;
  FPlayerStart *local_48;
  FPlayerStart *start;
  uint local_38;
  uint i;
  uint selections;
  int destAngle;
  DVector3 dest;
  bool pickup_local;
  AArtiTeleport *this_local;
  
  dest.Z._7_1_ = pickup;
  TVector3<double>::TVector3((TVector3<double> *)&selections);
  iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
  if (iVar3 == 0) {
    pAVar6 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
    local_48 = G_PickPlayerStart((int)((long)&pAVar6->player[-0x519b].ConversationNPC / 0x2a0),0);
    TVector3<double>::operator=((TVector3<double> *)&selections,&local_48->pos);
    sVar1 = local_48->angle;
  }
  else {
    local_38 = TArray<FPlayerStart,_FPlayerStart>::Size(&deathmatchstarts);
    uVar4 = FRandom::operator()(&pr_tele);
    start._4_4_ = uVar4 % local_38;
    pFVar5 = TArray<FPlayerStart,_FPlayerStart>::operator[](&deathmatchstarts,(ulong)start._4_4_);
    TVector3<double>::operator=((TVector3<double> *)&selections,&pFVar5->pos);
    pFVar5 = TArray<FPlayerStart,_FPlayerStart>::operator[](&deathmatchstarts,(ulong)start._4_4_);
    sVar1 = pFVar5->angle;
  }
  i = (uint)sVar1;
  dest.Y = -2147483648.0;
  pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AInventory).Owner);
  TVector3<double>::TVector3(&local_60,(TVector3<double> *)&selections);
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff98,(double)(int)i);
  P_Teleport(pAVar6,&local_60,(DAngle *)&stack0xffffffffffffff98,3);
  local_69 = 1;
  pAVar6 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
  if ((pAVar6->player->morphTics != 0) &&
     (pAVar6 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner),
     (pAVar6->player->MorphStyle & 8U) != 0)) {
    pAVar6 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
    activator = pAVar6->player;
    pAVar6 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
    bVar2 = P_UndoPlayerMorph(activator,pAVar6->player,8,false);
    if ((!bVar2) &&
       (pAVar6 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner),
       (pAVar6->player->MorphStyle & 0x20U) != 0)) {
      local_69 = 0;
    }
  }
  if ((local_69 & 1) != 0) {
    pAVar6 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AInventory).Owner);
    FSoundID::FSoundID(&local_70,"*evillaugh");
    S_Sound(pAVar6,2,&local_70,1.0,0.0);
  }
  return true;
}

Assistant:

bool AArtiTeleport::Use (bool pickup)
{
	DVector3 dest;
	int destAngle;

	if (deathmatch)
	{
		unsigned int selections = deathmatchstarts.Size ();
		unsigned int i = pr_tele() % selections;
		dest = deathmatchstarts[i].pos;
		destAngle = deathmatchstarts[i].angle;
	}
	else
	{
		FPlayerStart *start = G_PickPlayerStart(int(Owner->player - players));
		dest = start->pos;
		destAngle = start->angle;
	}
	dest.Z = ONFLOORZ;
	P_Teleport (Owner, dest, (double)destAngle, TELF_SOURCEFOG | TELF_DESTFOG);
	bool canlaugh = true;
 	if (Owner->player->morphTics && (Owner->player->MorphStyle & MORPH_UNDOBYCHAOSDEVICE))
 	{ // Teleporting away will undo any morph effects (pig)
		if (!P_UndoPlayerMorph (Owner->player, Owner->player, MORPH_UNDOBYCHAOSDEVICE)
			&& (Owner->player->MorphStyle & MORPH_FAILNOLAUGH))
		{
			canlaugh = false;
		}
 	}
	if (canlaugh)
 	{ // Full volume laugh
 		S_Sound (Owner, CHAN_VOICE, "*evillaugh", 1, ATTN_NONE);
 	}
	return true;
}